

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenRegVm_X86.cpp
# Opt level: O3

void GenCodeCmdCallPtr(CodeGenRegVmContext *ctx,RegVmCmd cmd)

{
  uint uVar1;
  uint uVar2;
  uint *puVar3;
  
  ctx->vmState->errorInvalidFunctionPointer = ErrorInvalidFunctionPointer;
  puVar3 = GetCodeCmdCallPrologue(ctx,cmd.argument);
  uVar1 = *puVar3;
  uVar2 = puVar3[1];
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov,rEDX,sDWORD,rEBX,(uint)((ulong)cmd >> 0x15) & 0x7f8);
  EMIT_OP_REG_NUM(&ctx->ctx,o_cmp,rEDX,0);
  EMIT_OP_LABEL(&ctx->ctx,o_jne,ctx->labelCount,0,0);
  EMIT_OP_NUM(&ctx->ctx,o_set_tracking,0);
  EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR13);
  EMIT_OP_RPTR_NUM(&ctx->ctx,o_mov,sDWORD,rEDI,0x168,ctx->currInstructionPos);
  EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,0xf8);
  EMIT_OP_NUM(&ctx->ctx,o_set_tracking,1);
  EMIT_LABEL(&ctx->ctx,ctx->labelCount,0);
  ctx->labelCount = ctx->labelCount + 1;
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rR13,0x178);
  EMIT_OP_REG_RPTR(&ctx->ctx,o_mov64,rEAX,sQWORD,rEDX,8,rEAX,0);
  EMIT_OP_REG_NUM(&ctx->ctx,o_cmp64,rEAX,0);
  EMIT_OP_LABEL(&ctx->ctx,o_je,ctx->labelCount,0,0);
  EMIT_OP_REG(&ctx->ctx,o_call,rEAX);
  EMIT_OP_LABEL(&ctx->ctx,o_jmp,ctx->labelCount + 1,0,0);
  EMIT_LABEL(&ctx->ctx,ctx->labelCount,0);
  ctx->labelCount = ctx->labelCount + 1;
  EMIT_OP_REG_REG(&ctx->ctx,o_mov64,rEDI,rR13);
  EMIT_OP_REG_REG(&ctx->ctx,o_mov,rESI,rEDX);
  EMIT_REG_READ(&ctx->ctx,rEDI);
  EMIT_REG_READ(&ctx->ctx,rESI);
  EMIT_OP_RPTR(&ctx->ctx,o_call,sQWORD,rEDI,0xd0);
  EMIT_LABEL(&ctx->ctx,ctx->labelCount,0);
  ctx->labelCount = ctx->labelCount + 1;
  GetCodeCmdCallEpilogue(ctx,puVar3 + 2,(uchar)uVar1,(uchar)uVar2);
  return;
}

Assistant:

void GenCodeCmdCallPtr(CodeGenRegVmContext &ctx, RegVmCmd cmd)
{
	ctx.vmState->errorInvalidFunctionPointer = ErrorInvalidFunctionPointer;

	unsigned *microcode = GetCodeCmdCallPrologue(ctx, cmd.argument);

	unsigned char resultReg = *microcode++ & 0xff;
	unsigned char resultType = *microcode++ & 0xff;

#if defined(_M_X64)
	// Get function id and check that it's valid
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rC * 8);
	EMIT_OP_REG_NUM(ctx.ctx, o_cmp, rEDX, 0);
	EMIT_OP_LABEL(ctx.ctx, o_jne, ctx.labelCount, false);

	EMIT_OP_NUM(ctx.ctx, o_set_tracking, 0);

	EMIT_OP_REG_REG(ctx.ctx, o_mov64, rArg1, rR13);
	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, rArg1, unsigned(uintptr_t(&ctx.vmState->callInstructionPos) - uintptr_t(ctx.vmState)), ctx.currInstructionPos);
	EMIT_OP_RPTR(ctx.ctx, o_call, sQWORD, rArg1, unsigned(uintptr_t(&ctx.vmState->errorInvalidFunctionPointer) - uintptr_t(ctx.vmState)));

	EMIT_OP_NUM(ctx.ctx, o_set_tracking, 1);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rR13, nullcOffsetOf(ctx.vmState, functionAddress));
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov64, rRAX, sQWORD, rRDX, 8, rRAX, 0);
	EMIT_OP_REG_NUM(ctx.ctx, o_cmp64, rRAX, 0);

	EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount, false);

	EMIT_OP_REG(ctx.ctx, o_call, rRAX);
	EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount + 1, false);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_REG_REG(ctx.ctx, o_mov64, rArg1, rR13);
	EMIT_OP_REG_REG(ctx.ctx, o_mov, rArg2, rEDX);
	EMIT_REG_READ(ctx.ctx, rArg1);
	EMIT_REG_READ(ctx.ctx, rArg2);
	EMIT_OP_RPTR(ctx.ctx, o_call, sQWORD, rArg1, nullcOffsetOf(ctx.vmState, callWrap));

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;
#else
	// Get function id and check that it's valid
	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEDX, sDWORD, rREG, cmd.rC * 8);
	EMIT_OP_REG_NUM(ctx.ctx, o_cmp, rEDX, 0);
	EMIT_OP_LABEL(ctx.ctx, o_jne, ctx.labelCount, false);

	EMIT_OP_NUM(ctx.ctx, o_set_tracking, 0);

	EMIT_OP_RPTR_NUM(ctx.ctx, o_mov, sDWORD, uintptr_t(&ctx.vmState->callInstructionPos), ctx.currInstructionPos);
	EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->errorInvalidFunctionPointer));

	EMIT_OP_NUM(ctx.ctx, o_set_tracking, 1);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_REG_RPTR(ctx.ctx, o_mov, rEAX, sDWORD, rEDX, 4, rNONE, (uintptr_t)ctx.vmState->functionAddress);
	EMIT_OP_REG_NUM(ctx.ctx, o_cmp, rEAX, 0);

	EMIT_OP_LABEL(ctx.ctx, o_je, ctx.labelCount, false);

	EMIT_OP_REG(ctx.ctx, o_call, rEAX);
	EMIT_OP_LABEL(ctx.ctx, o_jmp, ctx.labelCount + 1, false);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;

	EMIT_OP_REG(ctx.ctx, o_push, rEDX);
	EMIT_OP_NUM(ctx.ctx, o_push, uintptr_t(ctx.vmState));
	EMIT_OP_ADDR(ctx.ctx, o_call, sDWORD, uintptr_t(&ctx.vmState->callWrap));
	EMIT_OP_REG_NUM(ctx.ctx, o_add, rESP, 8);

	EMIT_LABEL(ctx.ctx, ctx.labelCount, false);
	ctx.labelCount++;
#endif

	GetCodeCmdCallEpilogue(ctx, microcode, resultReg, resultType);
}